

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::ReadChannelInfo
               (vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *channels,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  pointer *ptr;
  vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *this;
  string *in_RSI;
  ChannelInfo info;
  char *p;
  size_type in_stack_ffffffffffffff88;
  int *val;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff90;
  int *val_00;
  value_type *__x;
  value_type local_48;
  
  ptr = (pointer *)
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  while (*(value_type *)ptr != '\0') {
    __x = &local_48;
    anon_struct_48_5_57deb07a::ChannelInfo((anon_struct_48_5_57deb07a *)0x160452);
    this = (vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *)
           ReadString(in_RSI,(char *)ptr);
    local_48.pixel_type =
         *(int *)&(this->
                  super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    local_48.p_linear =
         *(uchar *)((long)&(this->
                           super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                           )._M_impl.super__Vector_impl_data._M_start + 4);
    val = &local_48.x_sampling;
    local_48.x_sampling =
         *(int *)&(this->
                  super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
    val_00 = &local_48.y_sampling;
    local_48.y_sampling =
         *(int *)((long)&(this->
                         super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                         )._M_impl.super__Vector_impl_data._M_finish + 4);
    ptr = &(this->super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage;
    swap4((uint *)&local_48.pixel_type);
    swap4((uint *)val);
    swap4((uint *)val_00);
    std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::push_back(this,__x);
    anon_struct_48_5_57deb07a::~ChannelInfo((anon_struct_48_5_57deb07a *)0x160521);
  }
  return;
}

Assistant:

static void ReadChannelInfo(std::vector<ChannelInfo> &channels,
                            const std::vector<unsigned char> &data) {
  const char *p = reinterpret_cast<const char *>(&data.at(0));

  for (;;) {
    if ((*p) == 0) {
      break;
    }
    ChannelInfo info;
    p = ReadString(&info.name, p);

    memcpy(&info.pixel_type, p, sizeof(int));
    p += 4;
    info.p_linear = static_cast<unsigned char>(p[0]);  // uchar
    p += 1 + 3;                                        // reserved: uchar[3]
    memcpy(&info.x_sampling, p, sizeof(int));          // int
    p += 4;
    memcpy(&info.y_sampling, p, sizeof(int));  // int
    p += 4;

    tinyexr::swap4(reinterpret_cast<unsigned int *>(&info.pixel_type));
    tinyexr::swap4(reinterpret_cast<unsigned int *>(&info.x_sampling));
    tinyexr::swap4(reinterpret_cast<unsigned int *>(&info.y_sampling));

    channels.push_back(info);
  }
}